

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     ,u8 *pEstWidth)

{
  u8 uVar1;
  short sVar2;
  anon_struct_4_7_7ffbf296_for_fg aVar3;
  SrcList *pSVar4;
  sqlite3 *psVar5;
  Select *pSVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  Table *pTVar11;
  Expr *pExpr_00;
  Schema **ppSVar12;
  anon_struct_4_7_7ffbf296_for_fg *paVar13;
  bool bVar14;
  u8 estWidth;
  char *zOrigCol;
  char *zOrigTab;
  char *zOrigDb;
  NameContext sNC;
  u8 local_99;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  Column *local_78;
  char **local_70;
  NameContext local_68;
  
  local_99 = '\x01';
  local_80 = (char *)0x0;
  local_88 = (char *)0x0;
  local_90 = (char *)0x0;
  local_98 = (char *)0x0;
  uVar1 = pExpr->op;
  if (uVar1 == 'w') {
    local_68.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_00164bde:
    local_68.pParse = pNC->pParse;
    local_68.pNext = pNC;
    local_80 = columnTypeImpl(&local_68,pExpr_00,&local_88,&local_90,&local_98,&local_99);
  }
  else {
    if ((uVar1 != 0x9a) && (uVar1 != 0x98)) goto LAB_00164c19;
    if (pNC == (NameContext *)0x0) {
      bVar14 = true;
      pSVar6 = (Select *)0x0;
      pTVar11 = (Table *)0x0;
    }
    else {
      pTVar11 = (Table *)0x0;
      pSVar6 = (Select *)0x0;
      do {
        pSVar4 = pNC->pSrcList;
        uVar9 = (ulong)pSVar4->nSrc;
        bVar14 = 0 < (long)uVar9;
        if ((long)uVar9 < 1) {
LAB_00164bb9:
          pNC = pNC->pNext;
        }
        else {
          if (pSVar4->a[0].iCursor == pExpr->iTable) {
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            paVar13 = &pSVar4[1].a[0].fg;
            do {
              if (uVar9 - 1 == uVar10) goto LAB_00164bb9;
              uVar10 = uVar10 + 1;
              aVar3 = *paVar13;
              paVar13 = paVar13 + 0x1c;
            } while (aVar3 != (anon_struct_4_7_7ffbf296_for_fg)pExpr->iTable);
            bVar14 = uVar10 < uVar9;
          }
          if (!bVar14) goto LAB_00164bb9;
          pTVar11 = pSVar4->a[uVar10].pTab;
          pSVar6 = pSVar4->a[uVar10].pSelect;
        }
        bVar14 = pTVar11 == (Table *)0x0;
      } while ((pNC != (NameContext *)0x0) && (pTVar11 == (Table *)0x0));
    }
    if (!bVar14) {
      sVar2 = pExpr->iColumn;
      uVar8 = (uint)sVar2;
      if (pSVar6 == (Select *)0x0) {
        if (pTVar11->pSchema != (Schema *)0x0) {
          if (sVar2 < 0) {
            uVar8 = (uint)pTVar11->iPKey;
          }
          local_70 = pzOrigCol;
          if ((int)uVar8 < 0) {
            local_98 = "rowid";
            local_80 = "INTEGER";
          }
          else {
            local_78 = pTVar11->aCol;
            local_98 = local_78[uVar8].zName;
            if ((local_78[uVar8].colFlags & 4) == 0) {
              local_80 = (char *)0x0;
            }
            else {
              local_80 = local_98;
              sVar7 = strlen(local_98);
              local_80 = local_80 + sVar7 + 1;
            }
            local_99 = local_78[uVar8].szEst;
          }
          local_90 = pTVar11->zName;
          pzOrigCol = local_70;
          if (pNC->pParse != (Parse *)0x0) {
            psVar5 = pNC->pParse->db;
            if (pTVar11->pSchema == (Schema *)0x0) {
              uVar9 = 0xfff0bdc0;
            }
            else {
              uVar8 = psVar5->nDb;
              if ((int)uVar8 < 1) {
                uVar9 = 0;
              }
              else {
                ppSVar12 = &psVar5->aDb->pSchema;
                uVar10 = 0;
                do {
                  uVar9 = uVar10;
                  if (*ppSVar12 == pTVar11->pSchema) break;
                  uVar10 = uVar10 + 1;
                  ppSVar12 = ppSVar12 + 4;
                  uVar9 = (ulong)uVar8;
                } while (uVar8 != uVar10);
              }
            }
            local_88 = psVar5->aDb[(int)uVar9].zDbSName;
          }
          goto LAB_00164c19;
        }
      }
      else if ((-1 < sVar2) && ((int)uVar8 < pSVar6->pEList->nExpr)) {
        local_68.pSrcList = pSVar6->pSrc;
        pExpr_00 = pSVar6->pEList->a[uVar8].pExpr;
        goto LAB_00164bde;
      }
    }
    local_80 = (char *)0x0;
  }
LAB_00164c19:
  if (pzOrigDb != (char **)0x0) {
    *pzOrigDb = local_88;
    *pzOrigTab = local_90;
    *pzOrigCol = local_98;
  }
  if (pEstWidth != (u8 *)0x0) {
    *pEstWidth = local_99;
  }
  return local_80;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
  Expr *pExpr,
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol,
#endif
  u8 *pEstWidth
){
  char const *zType = 0;
  int j;
  u8 estWidth = 1;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol, &estWidth); 
        }
      }else if( pTab->pSchema ){
        /* A real table */
        assert( !pS );
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol, &estWidth); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  if( pEstWidth ) *pEstWidth = estWidth;
  return zType;
}